

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O0

void mcmgarb(mcmcx1def *ctx)

{
  ushort uVar1;
  mcmcx1def *ctx_00;
  size_t sVar2;
  mcmcx1def *p_00;
  mcmcx1def *pmVar3;
  long *in_RDI;
  ushort flags;
  uchar *nxt;
  uchar *q;
  uchar *p;
  mcmhdef *h;
  mcmcx1def *in_stack_ffffffffffffffc0;
  mcmcx1def *in_stack_ffffffffffffffc8;
  mcmcx1def *p_01;
  mcmcx1def *pmVar4;
  mcmcx1def *ctx_01;
  
  ctx_01 = (mcmcx1def *)in_RDI[2];
  do {
    if (ctx_01 == (mcmcx1def *)0x0) {
      return;
    }
    ctx_00 = (mcmcx1def *)mcmffh(in_stack_ffffffffffffffc8,(uchar *)in_stack_ffffffffffffffc0);
    if (ctx_00 != (mcmcx1def *)0x0) {
      p_00 = ctx_00;
      sVar2 = osrndsz(2);
      p_01 = (mcmcx1def *)
             ((long)&ctx_00->mcmcxtab +
             (long)(int)(uint)*(ushort *)
                               (*(long *)(*in_RDI +
                                         (long)((int)(uint)*(ushort *)&p_00->mcmcxtab >> 8) * 8) +
                                (long)(int)(*(ushort *)&p_00->mcmcxtab & 0xff) * 0x20 + 0x18) +
             sVar2);
      pmVar4 = p_00;
      do {
        while( true ) {
          in_stack_ffffffffffffffc0 = pmVar4;
          pmVar4 = in_stack_ffffffffffffffc0;
          sVar2 = osrndsz(2);
          pmVar4 = (mcmcx1def *)
                   ((long)&in_stack_ffffffffffffffc0->mcmcxtab +
                   (long)(int)(uint)*(ushort *)
                                     (*(long *)(*in_RDI +
                                               (long)((int)(uint)*(ushort *)&pmVar4->mcmcxtab >> 8)
                                               * 8) +
                                      (long)(int)(*(ushort *)&pmVar4->mcmcxtab & 0xff) * 0x20 + 0x18
                                     ) + sVar2);
          in_stack_ffffffffffffffc8 = ctx_00;
          if (*(short *)&pmVar4->mcmcxtab == -1) goto LAB_00278043;
          uVar1 = *(ushort *)
                   (*(long *)(*in_RDI + (long)((int)(uint)*(ushort *)&pmVar4->mcmcxtab >> 8) * 8) +
                    (long)(int)(*(ushort *)&pmVar4->mcmcxtab & 0xff) * 0x20 + 0x14);
          if ((uVar1 & 4) != 0) break;
          if ((uVar1 & 0x80) != 0) {
            pmVar3 = p_00;
            if (pmVar4 != p_01) {
              pmVar3 = (mcmcx1def *)mcmreloc(ctx_01,(uchar *)p_00,(uchar *)pmVar4);
            }
            mcmconsol(pmVar4,(uchar *)p_01);
            p_00 = pmVar3;
            sVar2 = osrndsz(2);
            p_01 = (mcmcx1def *)
                   ((long)&pmVar3->mcmcxtab +
                   (long)(int)(uint)*(ushort *)
                                     (*(long *)(*in_RDI +
                                               (long)((int)(uint)*(ushort *)&p_00->mcmcxtab >> 8) *
                                               8) +
                                      (long)(int)(*(ushort *)&p_00->mcmcxtab & 0xff) * 0x20 + 0x18)
                   + sVar2);
            pmVar4 = p_00;
          }
        }
        p_00 = (mcmcx1def *)mcmffh(ctx_00,(uchar *)in_stack_ffffffffffffffc0);
        in_stack_ffffffffffffffc8 = ctx_00;
        pmVar4 = p_00;
      } while (p_00 != (mcmcx1def *)0x0);
    }
LAB_00278043:
    ctx_01 = (mcmcx1def *)ctx_01->mcmcxtab;
  } while( true );
}

Assistant:

static void mcmgarb(mcmcx1def *ctx)
{
    mcmhdef *h;
    uchar   *p;
    uchar   *q;
    uchar   *nxt;
    ushort   flags;
    
    MCMGLBCTX(ctx);

    for (h = ctx->mcmcxhpch ; h ; h = h->mcmhnxt)
    {
        p = (uchar *)(h+1);                   /* get pointer to actual heap */
        p = mcmffh(ctx, p);                 /* get first free block in heap */
        if (!p) continue;             /* can't do anything - no free blocks */
        nxt = mcmnxh(ctx, p);              /* remember immediate next block */
        
        for (q=p ;; )
        {
            q = mcmnxh(ctx, q);                  /* find next chunk in heap */
            if (*(mcmon *)q == MCMONINV) break;      /* reached end of heap */
            assert(mcmgobje(ctx, *(mcmon *)q)->mcmoptr
                   == q + osrndsz(sizeof(mcmon)));
            flags = mcmgobje(ctx, *(mcmon *)q)->mcmoflg;       /* get flags */

            /* if the block is locked, p can't be relocated */
            if (flags & MCMOFLOCK)
            {
                p = mcmffh(ctx, q);         /* find next free block after p */
                q = p;
                if (p) continue;   /* try again; start with next free block */
                else break;         /* no more free blocks - done with heap */
            }

            /* if the block is free, we can relocate between p and q */
            if (flags & MCMOFFREE)
            {
                if (q != nxt) p = mcmreloc(ctx, p, q);          /* relocate */
                mcmconsol(ctx, p);           /* consolidate two free blocks */
                
                /* resume looking, starting with consolidated block */
                nxt = mcmnxh(ctx, p);
                q = p;
                continue;
            }
        }
    }
}